

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argument_factory.hpp
# Opt level: O3

void __thiscall
boost::runtime::
argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
::produce_argument(argument_factory<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   *this,cstring *source,cstring *param_name,arguments_store *store)

{
  pointer pcVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  cstring local_18;
  
  local_18.m_begin._0_4_ = *(undefined4 *)&param_name->m_begin;
  local_18.m_begin._4_4_ = *(undefined4 *)((long)&param_name->m_begin + 4);
  local_18.m_end._0_4_ = *(undefined4 *)&param_name->m_end;
  local_18.m_end._4_4_ = *(undefined4 *)((long)&param_name->m_end + 4);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  if (source->m_end == source->m_begin) {
    pcVar1 = (this->m_optional_value)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_38,pcVar1,pcVar1 + (this->m_optional_value)._M_string_length);
  }
  else {
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_38);
  }
  arguments_store::set<std::__cxx11::string>(store,&local_18,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void        produce_argument( cstring source, cstring param_name, arguments_store& store ) const
    {
        store.set( param_name, source.empty() ? m_optional_value : m_interpreter.interpret( param_name, source ) );
    }